

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O0

void loadData(void)

{
  bool bVar1;
  istream *piVar2;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  string line;
  ifstream ignoredUsersFile;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc1;
  string local_228 [32];
  istream local_208 [520];
  
  std::ifstream::ifstream(local_208,"data/ignored_users.txt",_S_in);
  std::__cxx11::string::string(local_228);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_208,local_228);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    pVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT71(in_stack_fffffffffffffdc1,in_stack_fffffffffffffdc0),
                     (value_type *)in_stack_fffffffffffffdb8._M_node);
    in_stack_fffffffffffffdb8 = pVar3.first._M_node;
    in_stack_fffffffffffffdc0 = pVar3.second;
  }
  std::__cxx11::string::~string(local_228);
  std::ifstream::~ifstream(local_208);
  return;
}

Assistant:

void loadData() {
    std::ifstream ignoredUsersFile("data/ignored_users.txt");
    std::string line;
    while (std::getline(ignoredUsersFile, line)) {
        ignoredUsers.insert(line);
    }
}